

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall
duckdb::CSVReaderOptions::ParseOption
          (CSVReaderOptions *this,ClientContext *context,string *key,Value *val)

{
  case_insensitive_map_t<idx_t> *this_00;
  LogicalTypeId LVar1;
  pointer pVVar2;
  pointer pbVar3;
  LogicalType *pLVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Value *pVVar6;
  pointer pcVar7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var8;
  element_type *peVar9;
  CSVReaderOptions *this_01;
  bool bVar10;
  int iVar11;
  mapped_type *this_02;
  iterator iVar12;
  mapped_type *pmVar13;
  undefined8 uVar14;
  vector<duckdb::Value,_true> *pvVar15;
  string *psVar16;
  const_reference pvVar17;
  string *psVar18;
  mapped_type *pmVar19;
  LogicalType *pLVar20;
  BinderException *pBVar21;
  Value *child;
  LogicalType *this_03;
  pointer pVVar22;
  Value *pVVar23;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *str;
  long lVar24;
  byte bVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range5;
  pointer __k;
  idx_t iVar26;
  vector<duckdb::LogicalType,_true> *pvVar27;
  bool bVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  sql_type_names;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  column_names;
  LogicalType def_type;
  string loption;
  undefined1 local_248 [12];
  undefined4 uStack_23c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  uint8_t local_219;
  CSVReaderOptions *local_218;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Rb_tree_node_base *local_1f0;
  size_t local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e0;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  LogicalType local_1c0;
  ClientContext *local_1a8;
  string local_1a0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  aStack_1e0._8_8_ = key;
  local_1a8 = context;
  StringUtil::Lower(&local_1a0,(string *)key);
  bVar10 = StoreUserDefinedParameter((string *)&local_1a0);
  if (bVar10) {
    Value::ToSQLString_abi_cxx11_((string *)local_210,val);
    this_02 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->user_defined_parameters,(key_type *)&local_1a0);
    ::std::__cxx11::string::operator=((string *)this_02,(string *)local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._0_8_ != &local_200) {
      operator_delete((void *)local_210._0_8_);
    }
  }
  iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0);
  if (iVar11 == 0) {
    if ((this->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
      local_210._0_8_ = &local_200;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"read_csv column_names/names can only be supplied once","");
      BinderException::BinderException(pBVar21,(string *)local_210);
      __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->columns_set = true;
    if ((val->type_).id_ != STRUCT) {
      pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
      local_210._0_8_ = &local_200;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"read_csv columns requires a struct as input","");
      BinderException::BinderException(pBVar21,(string *)local_210);
      __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_218 = this;
    aStack_1e0._8_8_ = val;
    pvVar15 = StructValue::GetChildren(val);
    if ((pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_178 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_218->name_list;
      local_180 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&local_218->sql_types_per_column;
      pvVar27 = &local_218->sql_type_list;
      iVar26 = 0;
      do {
        psVar16 = StructType::GetChildName_abi_cxx11_((LogicalType *)aStack_1e0._8_8_,iVar26);
        pvVar17 = vector<duckdb::Value,_true>::operator[](pvVar15,iVar26);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_178,(value_type *)psVar16);
        if ((pvVar17->type_).id_ != VARCHAR) {
          pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
          local_210._0_8_ = &local_200;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_210,"read_csv requires a type specification as string","");
          BinderException::BinderException(pBVar21,(string *)local_210);
          __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pmVar19 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_180,(key_type *)psVar16);
        *pmVar19 = iVar26;
        psVar18 = StringValue::Get_abi_cxx11_(pvVar17);
        TransformStringToLogicalType((LogicalType *)local_210,(string *)psVar18,local_1a8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  (&pvVar27->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ,(LogicalType *)local_210);
        LogicalType::~LogicalType((LogicalType *)local_210);
        iVar26 = iVar26 + 1;
      } while (iVar26 < (ulong)((long)(pvVar15->
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar15->
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    if ((local_218->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_218->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
      local_210._0_8_ = &local_200;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"read_csv requires at least a single column as input!","");
      BinderException::BinderException(pBVar21,(string *)local_210);
      __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0);
    if (iVar11 == 0) {
      pLVar20 = (this->auto_type_candidates).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pLVar4 = (this->auto_type_candidates).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      this_03 = pLVar20;
      if (pLVar4 != pLVar20) {
        do {
          LogicalType::~LogicalType(this_03);
          this_03 = this_03 + 1;
        } while (this_03 != pLVar4);
        (this->auto_type_candidates).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish = pLVar20;
      }
      local_200._8_8_ = local_210 + 8;
      local_210._8_8_ = local_210._8_8_ & 0xffffffff00000000;
      local_200._M_allocated_capacity = 0;
      local_1e8 = 0;
      local_1f0 = (_Rb_tree_node_base *)local_200._8_8_;
      LogicalType::LogicalType((LogicalType *)local_248,VARCHAR);
      LogicalType::LogicalType(&local_1c0,VARCHAR);
      local_219 = GetCandidateSpecificity(&local_1c0);
      pmVar13 = ::std::
                map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                ::operator[]((map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                              *)local_210,&local_219);
      uVar14 = local_238._M_allocated_capacity;
      p_Var8 = stack0xfffffffffffffdc0;
      pmVar13->id_ = (LogicalTypeId)local_248[0];
      pmVar13->physical_type_ = local_248[1];
      uVar29 = *(undefined4 *)
                &(pmVar13->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar30 = *(undefined4 *)
                ((long)&(pmVar13->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      pVVar23 = (Value *)(pmVar13->type_info_).internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
      uVar31 = *(undefined4 *)
                &(pmVar13->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar32 = *(undefined4 *)
                ((long)&(pmVar13->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stack0xfffffffffffffdc0 =
           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)0x0;
      local_238._M_allocated_capacity = 0;
      p_Var5 = (pmVar13->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var8;
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        aStack_1e0._8_8_ = pVVar23;
        uStack_1d0 = uVar31;
        uStack_1cc = uVar32;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        uVar29 = aStack_1e0._8_4_;
        uVar30 = aStack_1e0._12_4_;
        uVar31 = uStack_1d0;
        uVar32 = uStack_1cc;
      }
      uVar14 = local_238._M_allocated_capacity;
      stack0xfffffffffffffdc0 =
           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)CONCAT44(uVar30,uVar29);
      local_238._M_allocated_capacity._4_4_ = uVar32;
      local_238._M_allocated_capacity._0_4_ = uVar31;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14);
      }
      LogicalType::~LogicalType(&local_1c0);
      LogicalType::~LogicalType((LogicalType *)local_248);
      LogicalType::LogicalType((LogicalType *)local_248,SQLNULL);
      LogicalType::LogicalType(&local_1c0,SQLNULL);
      local_219 = GetCandidateSpecificity(&local_1c0);
      pmVar13 = ::std::
                map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                ::operator[]((map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                              *)local_210,&local_219);
      uVar14 = local_238._M_allocated_capacity;
      peVar9 = (element_type *)stack0xfffffffffffffdc0;
      pmVar13->id_ = (LogicalTypeId)local_248[0];
      pmVar13->physical_type_ = local_248[1];
      uVar29 = *(undefined4 *)
                &(pmVar13->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar30 = *(undefined4 *)
                ((long)&(pmVar13->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      pVVar23 = (Value *)(pmVar13->type_info_).internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
      uVar31 = *(undefined4 *)
                &(pmVar13->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar32 = *(undefined4 *)
                ((long)&(pmVar13->type_info_).internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stack0xfffffffffffffdc0 =
           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)0x0;
      local_238._M_allocated_capacity = 0;
      p_Var5 = (pmVar13->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
      (pmVar13->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        aStack_1e0._8_8_ = pVVar23;
        uStack_1d0 = uVar31;
        uStack_1cc = uVar32;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        uVar29 = aStack_1e0._8_4_;
        uVar30 = aStack_1e0._12_4_;
        uVar31 = uStack_1d0;
        uVar32 = uStack_1cc;
      }
      uVar14 = local_238._M_allocated_capacity;
      stack0xfffffffffffffdc0 =
           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)CONCAT44(uVar30,uVar29);
      local_238._M_allocated_capacity._4_4_ = uVar32;
      local_238._M_allocated_capacity._0_4_ = uVar31;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14);
      }
      LogicalType::~LogicalType(&local_1c0);
      LogicalType::~LogicalType((LogicalType *)local_248);
      if ((val->type_).id_ != LIST) {
        pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
        local_248._0_8_ = &local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"read_csv auto_types requires a list as input","");
        BinderException::BinderException(pBVar21,(string *)local_248);
        __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar15 = ListValue::GetChildren(val);
      pVVar22 = (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar2 = (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar22 == pVVar2) {
        pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
        local_248._0_8_ = &local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"auto_type_candidates requires at least one type","");
        BinderException::BinderException(pBVar21,(string *)local_248);
        __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_218 = (CSVReaderOptions *)&this->auto_type_candidates;
      do {
        if ((pVVar22->type_).id_ != VARCHAR) {
          pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
          local_248._0_8_ = &local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,
                     "auto_type_candidates requires a type specification as string","");
          BinderException::BinderException(pBVar21,(string *)local_248);
          __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        psVar18 = StringValue::Get_abi_cxx11_(pVVar22);
        TransformStringToLogicalType((LogicalType *)local_248,(string *)psVar18,local_1a8);
        local_1c0.id_ = GetCandidateSpecificity((LogicalType *)local_248);
        pmVar13 = ::std::
                  map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                  ::operator[]((map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                                *)local_210,&local_1c0.id_);
        if (pmVar13 != (mapped_type *)local_248) {
          pmVar13->id_ = (LogicalTypeId)local_248[0];
          pmVar13->physical_type_ = local_248[1];
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pmVar13->type_info_,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_248 + 8)
                    );
        }
        LogicalType::~LogicalType((LogicalType *)local_248);
        this_01 = local_218;
        pVVar22 = pVVar22 + 1;
      } while (pVVar22 != pVVar2);
      for (uVar14 = local_200._8_8_;
          (_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)(local_210 + 8);
          uVar14 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14)) {
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
                   (LogicalType *)&((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_parent);
      }
      ::std::
      _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_duckdb::LogicalType>,_std::_Select1st<std::pair<const_unsigned_char,_duckdb::LogicalType>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_duckdb::LogicalType>,_std::_Select1st<std::pair<const_unsigned_char,_duckdb::LogicalType>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                   *)local_210);
    }
    else {
      iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0);
      if ((iVar11 == 0) ||
         (iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0), iVar11 == 0)) {
        local_210._0_8_ = &aStack_1e0;
        local_210._8_8_ = &DAT_00000001;
        local_200._M_allocated_capacity = 0;
        local_200._8_8_ = (_Rb_tree_node_base *)0x0;
        local_1f0 = (_Rb_tree_node_base *)CONCAT44(local_1f0._4_4_,0x3f800000);
        local_1e8 = 0;
        aStack_1e0._M_allocated_capacity = 0;
        if ((this->name_list).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->name_list).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
          local_248._0_8_ = &local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"read_csv column_names/names can only be supplied once","")
          ;
          BinderException::BinderException(pBVar21,(string *)local_248);
          __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (val->is_null == true) {
          pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
          local_248._0_8_ = &local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"read_csv %s cannot be NULL","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,*(long *)aStack_1e0._8_8_,
                     (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(aStack_1e0._8_8_ + 8))->
                             internal).
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar21,(string *)local_248,&local_50);
          __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar15 = ListValue::GetChildren(val);
        pVVar22 = (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar2 = (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pVVar22 != pVVar2) {
          do {
            if (pVVar22->is_null == true) {
              pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
              local_248._0_8_ = &local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_248,"read_csv %s parameter cannot have a NULL value","");
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,*(long *)aStack_1e0._8_8_,
                         (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(aStack_1e0._8_8_ + 8)
                                  )->internal).
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar21,(string *)local_248,&local_70);
              __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            psVar18 = StringValue::Get_abi_cxx11_(pVVar22);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&this->name_list,psVar18);
            pVVar22 = pVVar22 + 1;
          } while (pVVar22 != pVVar2);
        }
        __k = (this->name_list).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->name_list).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__k != pbVar3) {
          do {
            if (__k->_M_string_length == 0) {
LAB_0154ac65:
              pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
              local_248._0_8_ = &local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_248,
                         "read_csv %s cannot have empty (or all whitespace) value","");
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,*(long *)aStack_1e0._8_8_,
                         (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(aStack_1e0._8_8_ + 8)
                                  )->internal).
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar21,(string *)local_248,&local_90);
              __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            bVar10 = true;
            lVar24 = 0;
            do {
              bVar25 = (__k->_M_dataplus)._M_p[lVar24];
              bVar25 = (byte)(0x100003e00 >> (bVar25 & 0x3f)) & bVar25 < 0x21;
              if (bVar25 == 0) {
                bVar10 = false;
              }
            } while ((bVar25 == 1) &&
                    (bVar28 = __k->_M_string_length - 1 != lVar24, lVar24 = lVar24 + 1, bVar28));
            if (bVar10) goto LAB_0154ac65;
            iVar12 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_210,__k);
            if (iVar12.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
              local_248._0_8_ = &local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_248,
                         "read_csv %s must have unique values. \"%s\" is repeated.","");
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_170,*(long *)aStack_1e0._8_8_,
                         (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(aStack_1e0._8_8_ + 8)
                                  )->internal).
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              pcVar7 = (__k->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,pcVar7,pcVar7 + __k->_M_string_length);
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (pBVar21,(string *)local_248,&local_170,&local_b0);
              __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_248._0_8_ =
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_210;
            ::std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_210,__k,local_248);
            __k = __k + 1;
          } while (__k != pbVar3);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_210);
      }
      else {
        iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0);
        if (((iVar11 == 0) ||
            (iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0), iVar11 == 0)) ||
           (iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0), iVar11 == 0)) {
          LVar1 = (val->type_).id_;
          if ((LVar1 & ~SQLNULL) != STRUCT) {
            pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
            local_210._0_8_ = &local_200;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,"read_csv %s requires a struct or list as input","");
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,*(long *)aStack_1e0._8_8_,
                       (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(aStack_1e0._8_8_ + 8))
                               ->internal).
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar21,(string *)local_210,&local_d0);
            __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((this->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (this->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
            local_210._0_8_ = &local_200;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,
                       "read_csv column_types/types/dtypes can only be supplied once","");
            BinderException::BinderException(pBVar21,(string *)local_210);
            __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_248._0_8_ =
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)0x0;
          stack0xfffffffffffffdc0 =
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)0x0;
          local_238._M_allocated_capacity = 0;
          if (LVar1 == STRUCT) {
            local_218 = this;
            pvVar15 = StructValue::GetChildren(val);
            if ((pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start) {
              this_00 = &local_218->sql_types_per_column;
              iVar26 = 0;
              do {
                psVar16 = StructType::GetChildName_abi_cxx11_(&val->type_,iVar26);
                pvVar17 = vector<duckdb::Value,_true>::operator[](pvVar15,iVar26);
                if ((pvVar17->type_).id_ != VARCHAR) {
                  pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_210._0_8_ = &local_200;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_210,
                             "read_csv %s requires a type specification as string","");
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_f0,*(long *)aStack_1e0._8_8_,
                             (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                                      (aStack_1e0._8_8_ + 8))->internal).
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
                  BinderException::BinderException<std::__cxx11::string>
                            (pBVar21,(string *)local_210,&local_f0);
                  __cxa_throw(pBVar21,&BinderException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                psVar18 = StringValue::Get_abi_cxx11_(pvVar17);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_248,psVar18);
                pmVar19 = ::std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)this_00,(key_type *)psVar16);
                *pmVar19 = iVar26;
                iVar26 = iVar26 + 1;
              } while (iVar26 < (ulong)((long)(pvVar15->
                                              super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              ).
                                              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pvVar15->
                                              super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              ).
                                              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 6));
            }
          }
          else {
            local_218 = this;
            pLVar20 = ListType::GetChildType(&val->type_);
            if (pLVar20->id_ != VARCHAR) {
              pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
              local_210._0_8_ = &local_200;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_210,
                         "read_csv %s requires a list of types (varchar) as input","");
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,*(long *)aStack_1e0._8_8_,
                         (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(aStack_1e0._8_8_ + 8)
                                  )->internal).
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar21,(string *)local_210,&local_110);
              __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar15 = ListValue::GetChildren(val);
            pVVar6 = (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pVVar23 = (pvVar15->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start; pVVar23 != pVVar6;
                pVVar23 = pVVar23 + 1) {
              psVar18 = StringValue::Get_abi_cxx11_(pVVar23);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_248,psVar18);
            }
          }
          pvVar27 = &local_218->sql_type_list;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
                    (&pvVar27->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     (long)stack0xfffffffffffffdc0 - local_248._0_8_ >> 5);
          p_Var8 = stack0xfffffffffffffdc0;
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_248._0_8_ != stack0xfffffffffffffdc0) {
            str = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_248._0_8_;
            do {
              TransformStringToLogicalType(&local_1c0,(string *)str,local_1a8);
              if (local_1c0.id_ == USER) {
                pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
                local_210._0_8_ = &local_200;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_210,"Unrecognized type \"%s\" for read_csv %s definition"
                           ,"");
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_130,str->_M_buckets,
                           str->_M_bucket_count + (long)str->_M_buckets);
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,*(long *)aStack_1e0._8_8_,
                           (long)&((((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                                    (aStack_1e0._8_8_ + 8))->internal).
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->_vptr_ExtraTypeInfo + *(long *)aStack_1e0._8_8_);
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (pBVar21,(string *)local_210,&local_130,&local_150);
                __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
              emplace_back<duckdb::LogicalType>
                        (&pvVar27->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                         &local_1c0);
              LogicalType::~LogicalType(&local_1c0);
              str = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&str->_M_rehash_policy;
            } while (str != p_Var8);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_248);
        }
        else {
          iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0);
          if (iVar11 == 0) {
            bVar10 = GetBooleanValue((string *)&local_1a0,val);
            this->all_varchar = bVar10;
          }
          else {
            iVar11 = ::std::__cxx11::string::compare((char *)&local_1a0);
            if (iVar11 == 0) {
              bVar10 = GetBooleanValue((string *)&local_1a0,val);
              this->normalize_names = bVar10;
            }
            else {
              SetReadOption(this,(string *)&local_1a0,val,&this->name_list);
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CSVReaderOptions::ParseOption(ClientContext &context, const string &key, const Value &val) {
	auto loption = StringUtil::Lower(key);
	// skip variables that are specific to auto-detection
	if (StoreUserDefinedParameter(loption)) {
		user_defined_parameters[loption] = val.ToSQLString();
	}
	if (loption == "columns") {
		if (!name_list.empty()) {
			throw BinderException("read_csv column_names/names can only be supplied once");
		}
		columns_set = true;
		auto &child_type = val.type();
		if (child_type.id() != LogicalTypeId::STRUCT) {
			throw BinderException("read_csv columns requires a struct as input");
		}
		auto &struct_children = StructValue::GetChildren(val);
		D_ASSERT(StructType::GetChildCount(child_type) == struct_children.size());
		for (idx_t i = 0; i < struct_children.size(); i++) {
			auto &name = StructType::GetChildName(child_type, i);
			auto &val = struct_children[i];
			name_list.push_back(name);
			if (val.type().id() != LogicalTypeId::VARCHAR) {
				throw BinderException("read_csv requires a type specification as string");
			}
			sql_types_per_column[name] = i;
			sql_type_list.emplace_back(TransformStringToLogicalType(StringValue::Get(val), context));
		}
		if (name_list.empty()) {
			throw BinderException("read_csv requires at least a single column as input!");
		}
	} else if (loption == "auto_type_candidates") {
		auto_type_candidates.clear();
		map<uint8_t, LogicalType> candidate_types;
		// We always have the extremes of Null and Varchar, so we can default to varchar if the
		// sniffer is not able to confidently detect that column type
		candidate_types[GetCandidateSpecificity(LogicalType::VARCHAR)] = LogicalType::VARCHAR;
		candidate_types[GetCandidateSpecificity(LogicalType::SQLNULL)] = LogicalType::SQLNULL;

		auto &child_type = val.type();
		if (child_type.id() != LogicalTypeId::LIST) {
			throw BinderException("read_csv auto_types requires a list as input");
		}
		auto &list_children = ListValue::GetChildren(val);
		if (list_children.empty()) {
			throw BinderException("auto_type_candidates requires at least one type");
		}
		for (auto &child : list_children) {
			if (child.type().id() != LogicalTypeId::VARCHAR) {
				throw BinderException("auto_type_candidates requires a type specification as string");
			}
			auto candidate_type = TransformStringToLogicalType(StringValue::Get(child), context);
			candidate_types[GetCandidateSpecificity(candidate_type)] = candidate_type;
		}
		for (auto &candidate_type : candidate_types) {
			auto_type_candidates.emplace_back(candidate_type.second);
		}
	} else if (loption == "column_names" || loption == "names") {
		unordered_set<string> column_names;
		if (!name_list.empty()) {
			throw BinderException("read_csv column_names/names can only be supplied once");
		}
		if (val.IsNull()) {
			throw BinderException("read_csv %s cannot be NULL", key);
		}
		auto &children = ListValue::GetChildren(val);
		for (auto &child : children) {
			if (child.IsNull()) {
				throw BinderException("read_csv %s parameter cannot have a NULL value", key);
			}
			name_list.push_back(StringValue::Get(child));
		}
		for (auto &name : name_list) {
			bool empty = true;
			for (auto &c : name) {
				if (!StringUtil::CharacterIsSpace(c)) {
					empty = false;
					break;
				}
			}
			if (empty) {
				throw BinderException("read_csv %s cannot have empty (or all whitespace) value", key);
			}
			if (column_names.find(name) != column_names.end()) {
				throw BinderException("read_csv %s must have unique values. \"%s\" is repeated.", key, name);
			}
			column_names.insert(name);
		}
	} else if (loption == "column_types" || loption == "types" || loption == "dtypes") {
		auto &child_type = val.type();
		if (child_type.id() != LogicalTypeId::STRUCT && child_type.id() != LogicalTypeId::LIST) {
			throw BinderException("read_csv %s requires a struct or list as input", key);
		}
		if (!sql_type_list.empty()) {
			throw BinderException("read_csv column_types/types/dtypes can only be supplied once");
		}
		vector<string> sql_type_names;
		if (child_type.id() == LogicalTypeId::STRUCT) {
			auto &struct_children = StructValue::GetChildren(val);
			D_ASSERT(StructType::GetChildCount(child_type) == struct_children.size());
			for (idx_t i = 0; i < struct_children.size(); i++) {
				auto &name = StructType::GetChildName(child_type, i);
				auto &val = struct_children[i];
				if (val.type().id() != LogicalTypeId::VARCHAR) {
					throw BinderException("read_csv %s requires a type specification as string", key);
				}
				sql_type_names.push_back(StringValue::Get(val));
				sql_types_per_column[name] = i;
			}
		} else {
			auto &list_child = ListType::GetChildType(child_type);
			if (list_child.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("read_csv %s requires a list of types (varchar) as input", key);
			}
			auto &children = ListValue::GetChildren(val);
			for (auto &child : children) {
				sql_type_names.push_back(StringValue::Get(child));
			}
		}
		sql_type_list.reserve(sql_type_names.size());
		for (auto &sql_type : sql_type_names) {
			auto def_type = TransformStringToLogicalType(sql_type, context);
			if (def_type.id() == LogicalTypeId::USER) {
				throw BinderException("Unrecognized type \"%s\" for read_csv %s definition", sql_type, key);
			}
			sql_type_list.push_back(std::move(def_type));
		}
	} else if (loption == "all_varchar") {
		all_varchar = GetBooleanValue(loption, val);
	} else if (loption == "normalize_names") {
		normalize_names = GetBooleanValue(loption, val);
	} else {
		SetReadOption(loption, val, name_list);
	}
}